

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O2

void C_DrawConsole(bool hw2d)

{
  TObjPtr<AActor> *obj;
  FBrokenLines **ppFVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  FFont *pFVar6;
  DFrameBuffer *pDVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  BYTE *pBVar12;
  char *pcVar13;
  size_t sVar14;
  long lVar15;
  AActor *pAVar16;
  uint uVar17;
  int iVar18;
  FBrokenLines **p;
  player_t *ppVar19;
  FBrokenLines **ppFVar20;
  FTexture *img;
  BYTE character;
  int iVar21;
  uint uVar22;
  int iVar23;
  FString *pFVar24;
  int iVar25;
  int iVar26;
  bool bVar27;
  double dVar28;
  ulong in_stack_fffffffffffffe70;
  undefined4 uVar30;
  undefined8 uVar29;
  undefined8 in_stack_fffffffffffffe78;
  undefined4 uVar32;
  undefined8 uVar31;
  ulong in_stack_fffffffffffffe80;
  undefined4 uVar34;
  undefined8 uVar33;
  undefined8 in_stack_fffffffffffffe88;
  undefined4 uVar36;
  undefined8 uVar35;
  undefined8 in_stack_fffffffffffffe90;
  undefined4 uVar38;
  undefined8 uVar37;
  ulong in_stack_fffffffffffffe98;
  char tickstr [256];
  
  iVar9 = con_scale.Value;
  if (con_scale.Value == 0) {
    iVar9 = uiscale.Value;
  }
  if (iVar9 == 0) {
    iVar9 = CleanXfac;
  }
  iVar18 = ConFont->FontHeight;
  iVar21 = (ConBottom / iVar9 + iVar18 * -2) / iVar18;
  if ((iVar18 * 7) / -2 + ConBottom / iVar9 < (iVar21 + -1) * iVar18) {
    iVar18 = iVar18 / -2;
    iVar21 = iVar21 + -1;
  }
  else {
    iVar18 = -iVar18;
  }
  if ((ConBottom < C_DrawConsole::oldbottom) &&
     ((((gamestate == GS_TITLELEVEL || (gamestate == GS_LEVEL)) &&
       (viewwindowy != 0 || viewwindowx != 0)) && (viewactive)))) {
    V_SetBorderNeedRefresh();
  }
  iVar8 = NotifyTop;
  bVar5 = con_centernotify.Value;
  iVar25 = ConBottom;
  C_DrawConsole::oldbottom = ConBottom;
  if (ConsoleState == c_up) {
    if (1 < (uint)(gamestate + GS_FORCEWIPEBURN)) {
      iVar9 = SmallFont->FontHeight;
      iVar21 = active_con_scaletext();
      iVar18 = CleanYfac;
      if (iVar21 != 0) {
        iVar18 = 1;
      }
      iVar18 = iVar18 * iVar9;
      BorderTopRefresh =
           (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x20])();
      bVar4 = true;
      for (lVar15 = 0; lVar15 != 0x40; lVar15 = lVar15 + 0x10) {
        iVar9 = *(int *)((long)&NotifyStrings[0].TimeOut + lVar15);
        if (iVar9 != 0) {
          uVar17 = iVar9 - gametic;
          if (uVar17 == 0 || iVar9 < gametic) {
            if (bVar4) {
              NotifyTop = NotifyTop + iVar18;
              iVar8 = iVar8 + iVar18;
            }
            *(undefined4 *)((long)&NotifyStrings[0].TimeOut + lVar15) = 0;
          }
          else {
            iVar9 = *(int *)((long)&NotifyStrings[0].PrintLevel + lVar15);
            if ((show_messages.Value != false) || (bVar27 = iVar9 == 0x80, iVar9 = 0x80, bVar27)) {
              dVar28 = (double)(int)uVar17 / 6.0;
              if (5 < uVar17) {
                dVar28 = 1.0;
              }
              iVar21 = 0xb;
              if (iVar9 < 5) {
                iVar21 = PrintColors[iVar9];
              }
              iVar9 = active_con_scaletext();
              pDVar7 = screen;
              pFVar6 = SmallFont;
              if (iVar9 == 1) {
                if (bVar5 == false) {
                  pcVar13 = *(char **)((long)&NotifyStrings[0].Text.Chars + lVar15);
                  iVar9 = 0;
                }
                else {
                  iVar9 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
                  pFVar24 = (FString *)((long)&NotifyStrings[0].Text.Chars + lVar15);
                  iVar25 = FFont::StringWidth(SmallFont,pFVar24);
                  iVar9 = (iVar9 - iVar25) / 2;
                  pcVar13 = pFVar24->Chars;
                }
                DCanvas::DrawText((DCanvas *)pDVar7,pFVar6,iVar21,iVar9,iVar8,pcVar13,0x4000138c,
                                  dVar28,0);
              }
              else if (iVar9 == 0) {
                if (bVar5 == false) {
                  pcVar13 = *(char **)((long)&NotifyStrings[0].Text.Chars + lVar15);
                  iVar9 = 0;
                }
                else {
                  iVar9 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
                  pFVar24 = (FString *)((long)&NotifyStrings[0].Text.Chars + lVar15);
                  iVar25 = FFont::StringWidth(SmallFont,pFVar24);
                  iVar9 = (iVar9 - iVar25 * CleanXfac) / 2;
                  pcVar13 = pFVar24->Chars;
                }
                DCanvas::DrawText((DCanvas *)pDVar7,pFVar6,iVar21,iVar9,iVar8,pcVar13,0x40001393,
                                  dVar28,1,0x4000138c,0);
              }
              else {
                if (bVar5 == false) {
                  pcVar13 = *(char **)((long)&NotifyStrings[0].Text.Chars + lVar15);
                  uVar2 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar9;
                  uVar3 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Height / (long)iVar9;
                  iVar9 = 0;
                }
                else {
                  iVar25 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
                  pFVar24 = (FString *)((long)&NotifyStrings[0].Text.Chars + lVar15);
                  iVar23 = FFont::StringWidth(SmallFont,pFVar24);
                  iVar26 = active_con_scaletext();
                  iVar9 = (iVar25 / iVar9 - iVar23) / iVar26;
                  pcVar13 = pFVar24->Chars;
                  uVar2 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar26;
                  uVar3 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Height / (long)iVar26;
                }
                DCanvas::DrawText((DCanvas *)pDVar7,pFVar6,iVar21,iVar9,iVar8,pcVar13,0x40001399,
                                  dVar28,uVar2 & 0xffffffff,0x4000139a,uVar3 & 0xffffffff,0x400013a8
                                  ,1,0x4000138c,0);
              }
              iVar8 = iVar8 + iVar18;
              bVar4 = false;
            }
          }
        }
      }
      if (bVar4) {
        NotifyTop = 0;
      }
    }
  }
  else {
    if (ConBottom != 0) {
      in_stack_fffffffffffffe80 = 0;
      if ((uint)conback.texnum < TexMan.Textures.Count) {
        img = TexMan.Textures.Array[conback.texnum].Texture;
      }
      else {
        img = (FTexture *)0x0;
      }
      uVar17 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
      if (conshade != '\0') {
        in_stack_fffffffffffffe80 = 0xaf000000;
      }
      if (gamestate == GS_FULLCONSOLE) {
        dVar28 = 1.0;
      }
      else {
        dVar28 = (double)con_alpha.Value;
      }
      if (!hw2d) {
        dVar28 = 1.0;
      }
      in_stack_fffffffffffffe98 = 0;
      in_stack_fffffffffffffe90 = 0;
      in_stack_fffffffffffffe88 = 0;
      in_stack_fffffffffffffe78 = 0;
      in_stack_fffffffffffffe70 = 0;
      DCanvas::DrawTexture
                ((DCanvas *)screen,img,0.0,(double)(int)(ConBottom - uVar17),0x40001389,dVar28,
                 (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,0x4000138a,
                 (ulong)uVar17,0x400013aa,in_stack_fffffffffffffe80,0x4000138c,0x400013a5,0,0);
      if ((conline == '\x01') && (iVar25 < (screen->super_DSimpleCanvas).super_DCanvas.Height)) {
        in_stack_fffffffffffffe98 = in_stack_fffffffffffffe98 & 0xffffffff00000000;
        in_stack_fffffffffffffe90 = 0;
        (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                  (screen,0,(ulong)(uint)iVar25,
                   (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,
                   (ulong)(iVar25 + 1),0,in_stack_fffffffffffffe98);
      }
      pDVar7 = screen;
      pFVar6 = ConFont;
      uVar32 = (undefined4)((ulong)in_stack_fffffffffffffe78 >> 0x20);
      uVar36 = (undefined4)((ulong)in_stack_fffffffffffffe88 >> 0x20);
      uVar38 = (undefined4)((ulong)in_stack_fffffffffffffe90 >> 0x20);
      uVar30 = (undefined4)(in_stack_fffffffffffffe70 >> 0x20);
      uVar34 = (undefined4)(in_stack_fffffffffffffe80 >> 0x20);
      if (0xb < ConBottom) {
        iVar25 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
        if (iVar9 == 1) {
          pBVar12 = (BYTE *)GetVersionString();
          iVar8 = FFont::StringWidth(pFVar6,pBVar12);
          iVar23 = ConBottom - ConFont->FontHeight;
          pcVar13 = GetVersionString();
          in_stack_fffffffffffffe98 = in_stack_fffffffffffffe98 & 0xffffffff00000000;
          in_stack_fffffffffffffe90 = 0;
          DCanvas::DrawText((DCanvas *)pDVar7,pFVar6,8,(iVar25 - iVar8) + -8,iVar23 + -4,pcVar13,0);
        }
        else {
          pBVar12 = (BYTE *)GetVersionString();
          iVar23 = FFont::StringWidth(pFVar6,pBVar12);
          iVar26 = ConBottom / iVar9;
          iVar8 = ConFont->FontHeight;
          pcVar13 = GetVersionString();
          in_stack_fffffffffffffe80 =
               CONCAT44(uVar34,(screen->super_DSimpleCanvas).super_DCanvas.Height / iVar9);
          in_stack_fffffffffffffe70 =
               CONCAT44(uVar30,(screen->super_DSimpleCanvas).super_DCanvas.Width / iVar9);
          in_stack_fffffffffffffe98 = in_stack_fffffffffffffe98 & 0xffffffff00000000;
          in_stack_fffffffffffffe90 = CONCAT44(uVar38,1);
          in_stack_fffffffffffffe88 = CONCAT44(uVar36,0x400013a8);
          in_stack_fffffffffffffe78 = CONCAT44(uVar32,0x4000139a);
          DCanvas::DrawText((DCanvas *)pDVar7,pFVar6,8,(iVar25 / iVar9 - iVar23) + -8,
                            (iVar26 - iVar8) + -4,pcVar13,0x40001399,in_stack_fffffffffffffe70,
                            in_stack_fffffffffffffe78,in_stack_fffffffffffffe80,
                            in_stack_fffffffffffffe88,in_stack_fffffffffffffe90,
                            in_stack_fffffffffffffe98);
        }
        pcVar13 = TickerLabel;
        uVar30 = (undefined4)((ulong)in_stack_fffffffffffffe90 >> 0x20);
        uVar17 = (uint)(in_stack_fffffffffffffe98 >> 0x20);
        if (TickerMax == 0) {
          TickerVisible = 0;
        }
        else {
          iVar23 = ConBottom / iVar9;
          iVar25 = ConFont->FontHeight;
          uVar2 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar9;
          iVar8 = ConCols / iVar9 +
                  (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                       -0x5a) + -6;
          if (TickerLabel == (char *)0x0) {
            iVar26 = 0;
          }
          else {
            sVar14 = strlen(TickerLabel);
            iVar26 = (int)sVar14 + 2;
            mysnprintf(tickstr,0x100,"%s: ",pcVar13);
          }
          iVar10 = (*ConFont->_vptr_FFont[3])(ConFont,0x12);
          if (0x100 - iVar10 < iVar8) {
            iVar8 = (*ConFont->_vptr_FFont[3])(ConFont,0x12);
            iVar8 = 0x100 - iVar8;
          }
          tickstr[iVar26] = '\x10';
          memset(tickstr + (long)iVar26 + 1,0x11,(long)(iVar8 - iVar26));
          lVar15 = (long)iVar8;
          (tickstr + lVar15 + 1)[0] = '\x12';
          (tickstr + lVar15 + 1)[1] = ' ';
          if (TickerPercent == true) {
            mysnprintf(tickstr + lVar15 + 3,0xfd - lVar15,"%d%%",
                       ((long)(int)TickerAt * 100) / (long)(int)TickerMax & 0xffffffff);
          }
          else {
            tickstr[lVar15 + 3] = '\0';
          }
          iVar25 = (iVar23 - iVar25) + -4;
          if (iVar9 == 1) {
            uVar30 = 0;
            DCanvas::DrawText((DCanvas *)screen,ConFont,4,8,iVar25,tickstr,0);
          }
          else {
            lVar15 = (ulong)uVar17 << 0x20;
            in_stack_fffffffffffffe80 =
                 CONCAT44((int)(in_stack_fffffffffffffe80 >> 0x20),
                          (screen->super_DSimpleCanvas).super_DCanvas.Height / iVar9);
            in_stack_fffffffffffffe70 =
                 CONCAT44((int)(in_stack_fffffffffffffe70 >> 0x20),
                          (screen->super_DSimpleCanvas).super_DCanvas.Width / iVar9);
            uVar29 = CONCAT44(uVar30,1);
            in_stack_fffffffffffffe88 =
                 CONCAT44((int)((ulong)in_stack_fffffffffffffe88 >> 0x20),0x400013a8);
            in_stack_fffffffffffffe78 =
                 CONCAT44((int)((ulong)in_stack_fffffffffffffe78 >> 0x20),0x4000139a);
            DCanvas::DrawText((DCanvas *)screen,ConFont,4,8,iVar25,tickstr,0x40001399,
                              in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,
                              in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,uVar29,lVar15);
            uVar30 = (undefined4)((ulong)uVar29 >> 0x20);
            uVar17 = (uint)((ulong)lVar15 >> 0x20);
          }
          iVar8 = (int)(((long)((iVar8 - iVar26) * 8) * (long)(int)TickerAt) / (long)(int)TickerMax)
                  + iVar26 * 8 + 0xd;
          if (iVar9 == 1) {
            in_stack_fffffffffffffe98 = (ulong)uVar17 << 0x20;
            in_stack_fffffffffffffe90 = 0;
            DCanvas::DrawChar((DCanvas *)screen,ConFont,8,iVar8,iVar25,'\x13',0);
          }
          else {
            in_stack_fffffffffffffe80 =
                 CONCAT44((int)(in_stack_fffffffffffffe80 >> 0x20),
                          (screen->super_DSimpleCanvas).super_DCanvas.Height / iVar9);
            in_stack_fffffffffffffe70 =
                 CONCAT44((int)(in_stack_fffffffffffffe70 >> 0x20),
                          (screen->super_DSimpleCanvas).super_DCanvas.Width / iVar9);
            in_stack_fffffffffffffe98 = (ulong)uVar17 << 0x20;
            in_stack_fffffffffffffe90 = CONCAT44(uVar30,1);
            in_stack_fffffffffffffe88 =
                 CONCAT44((int)((ulong)in_stack_fffffffffffffe88 >> 0x20),0x400013a8);
            in_stack_fffffffffffffe78 =
                 CONCAT44((int)((ulong)in_stack_fffffffffffffe78 >> 0x20),0x4000139a);
            DCanvas::DrawChar((DCanvas *)screen,ConFont,8,iVar8,iVar25,'\x13',0x40001399,
                              in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,
                              in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,
                              in_stack_fffffffffffffe90,in_stack_fffffffffffffe98);
          }
          TickerVisible = 1;
        }
      }
      if (StatusBar != (DBaseStatusBar *)0x0 && !hw2d) {
        ppVar19 = StatusBar->CPlayer;
        obj = &ppVar19->camera;
        pAVar16 = GC::ReadBarrier<AActor>((AActor **)obj);
        if ((pAVar16 != (AActor *)0x0) &&
           (pAVar16 = GC::ReadBarrier<AActor>((AActor **)obj), pAVar16->player != (player_t *)0x0))
        {
          pAVar16 = GC::ReadBarrier<AActor>((AActor **)obj);
          ppVar19 = pAVar16->player;
        }
        if (((ppVar19->BlendA != 0.0) || (NAN(ppVar19->BlendA))) &&
           ((gamestate == GS_TITLELEVEL || (gamestate == GS_LEVEL)))) {
          (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                    (screen,(ulong)((int)(ppVar19->BlendB * 255.0) & 0xffU |
                                   ((int)(ppVar19->BlendG * 255.0) & 0xffU) << 8 |
                                   ((int)(ppVar19->BlendR * 255.0) & 0xffU) << 0x10),0,
                     (ulong)(uint)ConBottom,
                     (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,
                     (ulong)(uint)((screen->super_DSimpleCanvas).super_DCanvas.Height - ConBottom));
          ST_SetNeedRefresh();
          V_SetBorderNeedRefresh();
        }
      }
    }
    if ((menuactive == MENU_Off) && (0 < iVar21)) {
      FConsoleBuffer::FormatText(conbuffer,ConFont,ConWidth / iVar9);
      ppFVar1 = (conbuffer->mBrokenLines).Array;
      ppFVar20 = ppFVar1 + ((ulong)(uint)conbuffer->mTextLines - (long)RowAdjust);
      iVar8 = ConBottom / iVar9;
      iVar25 = ConFont->FontHeight;
      ConsoleDrawing = 1;
      while( true ) {
        uVar32 = (undefined4)((ulong)in_stack_fffffffffffffe78 >> 0x20);
        uVar36 = (undefined4)((ulong)in_stack_fffffffffffffe88 >> 0x20);
        uVar30 = (undefined4)(in_stack_fffffffffffffe70 >> 0x20);
        uVar34 = (undefined4)(in_stack_fffffffffffffe80 >> 0x20);
        uVar38 = (undefined4)((ulong)in_stack_fffffffffffffe90 >> 0x20);
        uVar17 = (uint)(in_stack_fffffffffffffe98 >> 0x20);
        ppFVar20 = ppFVar20 + -1;
        if ((ppFVar20 < ppFVar1) || (iVar21 < 1)) break;
        iVar23 = ConFont->FontHeight * iVar21 + iVar18;
        pcVar13 = ((*ppFVar20)->Text).Chars;
        if (iVar9 == 1) {
          in_stack_fffffffffffffe98 = 0;
          in_stack_fffffffffffffe90 = 0;
          DCanvas::DrawText((DCanvas *)screen,ConFont,1,8,iVar23,pcVar13,0);
        }
        else {
          in_stack_fffffffffffffe70 =
               (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar9 & 0xffffffff;
          in_stack_fffffffffffffe80 =
               (long)(screen->super_DSimpleCanvas).super_DCanvas.Height / (long)iVar9 & 0xffffffff;
          in_stack_fffffffffffffe98 = 0;
          in_stack_fffffffffffffe90 = 0;
          in_stack_fffffffffffffe88 = 0;
          in_stack_fffffffffffffe78 = 0;
          DCanvas::DrawText((DCanvas *)screen,ConFont,1,8,iVar23,pcVar13,0x40001399,
                            in_stack_fffffffffffffe70,0x4000139a,in_stack_fffffffffffffe80,
                            0x400013a8,1,0);
        }
        iVar21 = iVar21 + -1;
      }
      ConsoleDrawing = 0;
      if (0x13 < ConBottom) {
        iVar18 = iVar8 + iVar25 * -2 + -4;
        if (gamestate != GS_STARTUP) {
          CmdLine[(ulong)CmdLine[0] + 2] = '\0';
          FString::FString((FString *)tickstr,(char *)(CmdLine + (ulong)CmdLine[0x103] + 2));
          uVar22 = (uint)CmdLine[1];
          uVar11 = (uint)CmdLine[0x103];
          if (iVar9 == 1) {
            in_stack_fffffffffffffe98 = (ulong)uVar17 << 0x20;
            DCanvas::DrawChar((DCanvas *)screen,ConFont,8,8,iVar18,'\x1c',0);
            pDVar7 = screen;
            pFVar6 = ConFont;
            iVar21 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
            in_stack_fffffffffffffe98 = in_stack_fffffffffffffe98 & 0xffffffff00000000;
            uVar38 = 0;
            DCanvas::DrawText((DCanvas *)pDVar7,pFVar6,8,iVar21 + 8,iVar18,(char *)tickstr._0_8_,0);
            pDVar7 = screen;
            pFVar6 = ConFont;
            if (cursoron == true) {
              iVar21 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
              iVar25 = (*ConFont->_vptr_FFont[3])(ConFont,0xb);
              in_stack_fffffffffffffe98 = in_stack_fffffffffffffe98 & 0xffffffff00000000;
              uVar38 = 0;
              DCanvas::DrawChar((DCanvas *)pDVar7,pFVar6,10,iVar21 + iVar25 * (uVar22 - uVar11) + 8,
                                iVar18,'\v',0);
            }
          }
          else {
            uVar33 = CONCAT44(uVar34,(screen->super_DSimpleCanvas).super_DCanvas.Height / iVar9);
            uVar29 = CONCAT44(uVar30,(screen->super_DSimpleCanvas).super_DCanvas.Width / iVar9);
            in_stack_fffffffffffffe98 = (ulong)uVar17 << 0x20;
            uVar37 = CONCAT44(uVar38,1);
            uVar35 = CONCAT44(uVar36,0x400013a8);
            uVar31 = CONCAT44(uVar32,0x4000139a);
            DCanvas::DrawChar((DCanvas *)screen,ConFont,8,8,iVar18,'\x1c',0x40001399,uVar29,uVar31,
                              uVar33,uVar35,uVar37,in_stack_fffffffffffffe98);
            pDVar7 = screen;
            pFVar6 = ConFont;
            uVar32 = (undefined4)((ulong)uVar31 >> 0x20);
            uVar36 = (undefined4)((ulong)uVar35 >> 0x20);
            uVar38 = (undefined4)((ulong)uVar37 >> 0x20);
            uVar30 = (undefined4)((ulong)uVar29 >> 0x20);
            uVar34 = (undefined4)((ulong)uVar33 >> 0x20);
            iVar21 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
            uVar33 = CONCAT44(uVar34,(screen->super_DSimpleCanvas).super_DCanvas.Height / iVar9);
            uVar29 = CONCAT44(uVar30,(screen->super_DSimpleCanvas).super_DCanvas.Width / iVar9);
            in_stack_fffffffffffffe98 = in_stack_fffffffffffffe98 & 0xffffffff00000000;
            uVar37 = CONCAT44(uVar38,1);
            uVar35 = CONCAT44(uVar36,0x400013a8);
            uVar31 = CONCAT44(uVar32,0x4000139a);
            DCanvas::DrawText((DCanvas *)pDVar7,pFVar6,8,iVar21 + 8,iVar18,(char *)tickstr._0_8_,
                              0x40001399,uVar29,uVar31,uVar33,uVar35,uVar37,
                              in_stack_fffffffffffffe98);
            pDVar7 = screen;
            pFVar6 = ConFont;
            uVar32 = (undefined4)((ulong)uVar31 >> 0x20);
            uVar36 = (undefined4)((ulong)uVar35 >> 0x20);
            uVar38 = (undefined4)((ulong)uVar37 >> 0x20);
            uVar30 = (undefined4)((ulong)uVar29 >> 0x20);
            uVar34 = (undefined4)((ulong)uVar33 >> 0x20);
            if (cursoron == true) {
              iVar21 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
              iVar25 = (*ConFont->_vptr_FFont[3])(ConFont,0xb);
              uVar33 = CONCAT44(uVar34,(screen->super_DSimpleCanvas).super_DCanvas.Height / iVar9);
              uVar29 = CONCAT44(uVar30,(screen->super_DSimpleCanvas).super_DCanvas.Width / iVar9);
              in_stack_fffffffffffffe98 = in_stack_fffffffffffffe98 & 0xffffffff00000000;
              uVar37 = CONCAT44(uVar38,1);
              uVar35 = CONCAT44(uVar36,0x400013a8);
              uVar31 = CONCAT44(uVar32,0x4000139a);
              DCanvas::DrawChar((DCanvas *)pDVar7,pFVar6,10,iVar21 + iVar25 * (uVar22 - uVar11) + 8,
                                iVar18,'\v',0x40001399,uVar29,uVar31,uVar33,uVar35,uVar37,
                                in_stack_fffffffffffffe98);
              uVar32 = (undefined4)((ulong)uVar31 >> 0x20);
              uVar36 = (undefined4)((ulong)uVar35 >> 0x20);
              uVar38 = (undefined4)((ulong)uVar37 >> 0x20);
              uVar30 = (undefined4)((ulong)uVar29 >> 0x20);
              uVar34 = (undefined4)((ulong)uVar33 >> 0x20);
            }
          }
          FString::~FString((FString *)tickstr);
        }
        if ((RowAdjust != 0) && ((ConFont->FontHeight * 7) / 2 <= ConBottom)) {
          character = (RowAdjust == conbuffer->mTextLines) * '\x02' + '\n';
          if (iVar9 == 1) {
            DCanvas::DrawChar((DCanvas *)screen,ConFont,3,0,iVar18,character,0);
          }
          else {
            DCanvas::DrawChar((DCanvas *)screen,ConFont,3,0,iVar18,character,0x40001399,
                              CONCAT44(uVar30,(screen->super_DSimpleCanvas).super_DCanvas.Width /
                                              iVar9),CONCAT44(uVar32,0x4000139a),
                              CONCAT44(uVar34,(screen->super_DSimpleCanvas).super_DCanvas.Height /
                                              iVar9),CONCAT44(uVar36,0x400013a8),CONCAT44(uVar38,1),
                              in_stack_fffffffffffffe98 & 0xffffffff00000000);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void C_DrawConsole (bool hw2d)
{
	static int oldbottom = 0;
	int lines, left, offset;

	int textScale = active_con_scale();
	if (textScale == 0)
		textScale = CleanXfac;

	left = LEFTMARGIN;
	lines = (ConBottom/textScale-ConFont->GetHeight()*2)/ConFont->GetHeight();
	if (-ConFont->GetHeight() + lines*ConFont->GetHeight() > ConBottom/textScale - ConFont->GetHeight()*7/2)
	{
		offset = -ConFont->GetHeight()/2;
		lines--;
	}
	else
	{
		offset = -ConFont->GetHeight();
	}

	if ((ConBottom < oldbottom) &&
		(gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL) &&
		(viewwindowx || viewwindowy) &&
		viewactive)
	{
		V_SetBorderNeedRefresh();
	}

	oldbottom = ConBottom;

	if (ConsoleState == c_up)
	{
		C_DrawNotifyText ();
		return;
	}
	else if (ConBottom)
	{
		int visheight;
		FTexture *conpic = TexMan[conback];

		visheight = ConBottom;

		screen->DrawTexture (conpic, 0, visheight - screen->GetHeight(),
			DTA_DestWidth, screen->GetWidth(),
			DTA_DestHeight, screen->GetHeight(),
			DTA_ColorOverlay, conshade,
			DTA_AlphaF, (hw2d && gamestate != GS_FULLCONSOLE) ? (double)con_alpha : 1.,
			DTA_Masked, false,
			TAG_DONE);
		if (conline && visheight < screen->GetHeight())
		{
			screen->Clear (0, visheight, screen->GetWidth(), visheight+1, 0, 0);
		}

		if (ConBottom >= 12)
		{
			if (textScale == 1)
				screen->DrawText (ConFont, CR_ORANGE, SCREENWIDTH - 8 -
					ConFont->StringWidth (GetVersionString()),
					ConBottom / textScale - ConFont->GetHeight() - 4,
					GetVersionString(), TAG_DONE);
			else
				screen->DrawText(ConFont, CR_ORANGE, SCREENWIDTH / textScale - 8 -
					ConFont->StringWidth(GetVersionString()),
					ConBottom / textScale - ConFont->GetHeight() - 4,
					GetVersionString(),
					DTA_VirtualWidth, screen->GetWidth() / textScale,
					DTA_VirtualHeight, screen->GetHeight() / textScale,
					DTA_KeepRatio, true, TAG_DONE);

			if (TickerMax)
			{
				char tickstr[256];
				const int tickerY = ConBottom / textScale - ConFont->GetHeight() - 4;
				size_t i;
				int tickend = ConCols / textScale - SCREENWIDTH / textScale / 90 - 6;
				int tickbegin = 0;

				if (TickerLabel)
				{
					tickbegin = (int)strlen (TickerLabel) + 2;
					mysnprintf (tickstr, countof(tickstr), "%s: ", TickerLabel);
				}
				if (tickend > 256 - ConFont->GetCharWidth(0x12))
					tickend = 256 - ConFont->GetCharWidth(0x12);
				tickstr[tickbegin] = 0x10;
				memset (tickstr + tickbegin + 1, 0x11, tickend - tickbegin);
				tickstr[tickend + 1] = 0x12;
				tickstr[tickend + 2] = ' ';
				if (TickerPercent)
				{
					mysnprintf (tickstr + tickend + 3, countof(tickstr) - tickend - 3,
						"%d%%", Scale (TickerAt, 100, TickerMax));
				}
				else
				{
					tickstr[tickend+3] = 0;
				}
				if (textScale == 1)
					screen->DrawText (ConFont, CR_BROWN, LEFTMARGIN, tickerY, tickstr, TAG_DONE);
				else
					screen->DrawText (ConFont, CR_BROWN, LEFTMARGIN, tickerY, tickstr,
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);

				// Draw the marker
				i = LEFTMARGIN+5+tickbegin*8 + Scale (TickerAt, (SDWORD)(tickend - tickbegin)*8, TickerMax);
				if (textScale == 1)
					screen->DrawChar (ConFont, CR_ORANGE, (int)i, tickerY, 0x13, TAG_DONE);
				else
					screen->DrawChar(ConFont, CR_ORANGE, (int)i, tickerY, 0x13,
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);

				TickerVisible = true;
			}
			else
			{
				TickerVisible = false;
			}
		}

		// Apply palette blend effects
		if (StatusBar != NULL && !hw2d)
		{
			player_t *player = StatusBar->CPlayer;
			if (player->camera != NULL && player->camera->player != NULL)
			{
				player = player->camera->player;
			}
			if (player->BlendA != 0 && (gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL))
			{
				screen->Dim (PalEntry ((unsigned char)(player->BlendR*255), (unsigned char)(player->BlendG*255), (unsigned char)(player->BlendB*255)),
					player->BlendA, 0, ConBottom, screen->GetWidth(), screen->GetHeight() - ConBottom);
				ST_SetNeedRefresh();
				V_SetBorderNeedRefresh();
			}
		}
	}

	if (menuactive != MENU_Off)
	{
		return;
	}

	if (lines > 0)
	{
		// No more enqueuing because adding new text to the console won't touch the actual print data.
		conbuffer->FormatText(ConFont, ConWidth / textScale);
		unsigned int consolelines = conbuffer->GetFormattedLineCount();
		FBrokenLines **blines = conbuffer->GetLines();
		FBrokenLines **printline = blines + consolelines - 1 - RowAdjust;

		int bottomline = ConBottom / textScale - ConFont->GetHeight()*2 - 4;

		ConsoleDrawing = true;

		for(FBrokenLines **p = printline; p >= blines && lines > 0; p--, lines--)
		{
			if (textScale == 1)
			{
				screen->DrawText(ConFont, CR_TAN, LEFTMARGIN, offset + lines * ConFont->GetHeight(), (*p)->Text, TAG_DONE);
			}
			else
			{
				screen->DrawText(ConFont, CR_TAN, LEFTMARGIN, offset + lines * ConFont->GetHeight(), (*p)->Text,
					DTA_VirtualWidth, screen->GetWidth() / textScale,
					DTA_VirtualHeight, screen->GetHeight() / textScale,
					DTA_KeepRatio, true, TAG_DONE);
			}
		}

		ConsoleDrawing = false;

		if (ConBottom >= 20)
		{
			if (gamestate != GS_STARTUP)
			{
				// Make a copy of the command line, in case an input event is handled
				// while we draw the console and it changes.
				CmdLine[2+CmdLine[0]] = 0;
				FString command((char *)&CmdLine[2+CmdLine[259]]);
				int cursorpos = CmdLine[1] - CmdLine[259];

				if (textScale == 1)
				{
					screen->DrawChar(ConFont, CR_ORANGE, left, bottomline, '\x1c', TAG_DONE);
					screen->DrawText(ConFont, CR_ORANGE, left + ConFont->GetCharWidth(0x1c), bottomline,
						command, TAG_DONE);

					if (cursoron)
					{
						screen->DrawChar(ConFont, CR_YELLOW, left + ConFont->GetCharWidth(0x1c) + cursorpos * ConFont->GetCharWidth(0xb),
							bottomline, '\xb', TAG_DONE);
					}
				}
				else
				{
					screen->DrawChar(ConFont, CR_ORANGE, left, bottomline, '\x1c',
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);

					screen->DrawText(ConFont, CR_ORANGE, left + ConFont->GetCharWidth(0x1c), bottomline,
						command,
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);

					if (cursoron)
					{
						screen->DrawChar(ConFont, CR_YELLOW, left + ConFont->GetCharWidth(0x1c) + cursorpos * ConFont->GetCharWidth(0xb),
							bottomline, '\xb',
							DTA_VirtualWidth, screen->GetWidth() / textScale,
							DTA_VirtualHeight, screen->GetHeight() / textScale,
							DTA_KeepRatio, true, TAG_DONE);
					}
				}
			}
			if (RowAdjust && ConBottom >= ConFont->GetHeight()*7/2)
			{
				// Indicate that the view has been scrolled up (10)
				// and if we can scroll no further (12)
				if (textScale == 1)
					screen->DrawChar (ConFont, CR_GREEN, 0, bottomline, RowAdjust == conbuffer->GetFormattedLineCount() ? 12 : 10, TAG_DONE);
				else
					screen->DrawChar(ConFont, CR_GREEN, 0, bottomline, RowAdjust == conbuffer->GetFormattedLineCount() ? 12 : 10,
						DTA_VirtualWidth, screen->GetWidth() / textScale,
						DTA_VirtualHeight, screen->GetHeight() / textScale,
						DTA_KeepRatio, true, TAG_DONE);
			}
		}
	}
}